

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,Fl_Tree_Item *item)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->_children)._total;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  do {
    if (uVar2 == uVar3) {
LAB_001d5dac:
      return -(uint)((long)(int)uVar1 <= (long)uVar3);
    }
    if ((this->_children)._items[uVar3] == item) {
      Fl_Tree_Item_Array::clear(&item->_children);
      Fl_Tree_Item_Array::remove(&this->_children,(char *)(uVar3 & 0xffffffff));
      goto LAB_001d5dac;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Fl_Tree_Item::remove_child(Fl_Tree_Item *item) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t) == item ) {
      item->clear_children();
      _children.remove(t);
      recalc_tree();		// may change tree geometry
      return(0);
    }
  }
  return(-1);
}